

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall HSlider::draw(HSlider *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  uint uVar8;
  Theme *pTVar9;
  int iVar10;
  Widget *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float fVar11;
  int xpos;
  double ratio;
  ALLEGRO_COLOR bg;
  SaveState state;
  int cy;
  Theme *theme;
  int in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 local_428;
  undefined8 uStack_420;
  
  pTVar9 = Dialog::get_theme(in_RDI->dialog);
  iVar1 = in_RDI->y1;
  iVar2 = in_RDI->y2;
  anon_unknown.dwarf_9285::SaveState::SaveState
            ((SaveState *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb2c);
  uVar7 = (pTVar9->bg).r;
  uStack_420._0_4_ = (pTVar9->bg).b;
  uStack_420._4_4_ = (pTVar9->bg).a;
  uVar8 = (*in_RDI->_vptr_Widget[0x10])();
  local_428 = uVar7;
  if ((uVar8 & 1) != 0) {
    local_428 = al_map_rgb(0x40,0x40);
    uStack_420 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  }
  al_draw_filled_rectangle
            ((float)in_RDI->x1,(float)in_RDI->y1,(float)in_RDI->x2,(float)in_RDI->y2,local_428,
             uStack_420);
  fVar11 = (float)((iVar1 + iVar2) / 2);
  uVar3 = (pTVar9->fg).r;
  uVar4._0_4_ = (pTVar9->fg).b;
  uVar4._4_4_ = (pTVar9->fg).a;
  al_draw_line((float)in_RDI->x1,fVar11,(float)in_RDI->x2,fVar11,uVar3,uVar4,0);
  iVar1 = *(int *)&in_RDI->field_0x34;
  iVar2 = *(int *)&in_RDI[1]._vptr_Widget;
  iVar10 = in_RDI->x1;
  uVar8 = Widget::width(in_RDI);
  iVar10 = iVar10 + (int)(((double)iVar1 / (double)iVar2) * (double)(uVar8 - 2));
  uVar5 = (pTVar9->fg).r;
  uVar6._0_4_ = (pTVar9->fg).b;
  uVar6._4_4_ = (pTVar9->fg).a;
  al_draw_filled_rectangle
            ((float)(iVar10 + -2),(float)in_RDI->y1,(float)(iVar10 + 2),(float)in_RDI->y2,uVar5,
             uVar6);
  anon_unknown.dwarf_9285::SaveState::~SaveState((SaveState *)0x1140c1);
  return;
}

Assistant:

void HSlider::draw()
{
   const Theme & theme = dialog->get_theme();
   const int cy = (y1 + y2) / 2;
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);
   al_draw_line(x1, cy, x2, cy, theme.fg, 0);

   double ratio = (double) this->cur_value / (double) this->max_value;
   int xpos = x1 + (int) (ratio * (width() - 2));
   al_draw_filled_rectangle(xpos - 2, y1, xpos + 2, y2, theme.fg);
}